

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall GEO::Delaunay3d::nearest_vertex(Delaunay3d *this,double *p)

{
  index_t iVar1;
  bool bVar2;
  index_t t;
  index_t iVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  if (this->weighted_ == false) {
    iVar3 = 0xffffffff;
    t = locate(this,p,0xffffffff,(this->super_Delaunay).neighbors_.thread_safe_,(Sign *)0x0);
    if ((t != 0xffffffff) && (bVar2 = tet_is_virtual(this,t), !bVar2)) {
      dVar5 = 1e+30;
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        iVar1 = (this->cell_to_v_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
                .super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                super__Vector_impl_data._M_start[(ulong)(t << 2) + lVar4];
        if ((-1 < (int)iVar1) &&
           (dVar6 = Geom::distance2<double>
                              (p,(this->super_Delaunay).vertices_ +
                                 (this->super_Delaunay).vertex_stride_ * iVar1,'\x03'),
           dVar6 < dVar5)) {
          dVar5 = dVar6;
          iVar3 = iVar1;
        }
      }
      return iVar3;
    }
  }
  iVar3 = Delaunay::nearest_vertex(&this->super_Delaunay,p);
  return iVar3;
}

Assistant:

index_t Delaunay3d::nearest_vertex(const double* p) const {

        // TODO: For the moment, we fallback to the (unefficient)
        // baseclass implementation when in weighted mode.
        if(weighted_) {
            return Delaunay::nearest_vertex(p);
        }

        // Find a tetrahedron (real or virtual) that contains p
        index_t t = locate(p, NO_TETRAHEDRON, thread_safe());

        //   If p is outside the convex hull of the inserted points,
        // a special traversal is required (not implemented yet).
        // TODO: implement convex hull boundary traversal
        // (for now we fallback to linear search implemented
        //  in baseclass)
        if(t == NO_TETRAHEDRON || tet_is_virtual(t)) {
            return Delaunay::nearest_vertex(p);
        }

        double sq_dist = 1e30;
        index_t result = NO_TETRAHEDRON;

        // Find the nearest vertex among t's vertices
        for(index_t lv = 0; lv < 4; ++lv) {
            signed_index_t v = tet_vertex(t, lv);
            // If the tetrahedron is virtual, then the first vertex
            // is the vertex at infinity and is skipped.
            if(v < 0) {
                continue;
            }
            double cur_sq_dist = Geom::distance2(p, vertex_ptr(index_t(v)), 3);
            if(cur_sq_dist < sq_dist) {
                sq_dist = cur_sq_dist;
                result = index_t(v);
            }
        }
        return result;
    }